

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::transferTypeAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes,TType *type,
          bool allowEntry)

{
  _List_node_base *this_00;
  ulong *puVar1;
  byte *pbVar2;
  _List_node_base *p_Var3;
  undefined1 uVar4;
  undefined2 uVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  long lVar9;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  undefined7 in_register_00000081;
  _func_int **pp_Var13;
  ulong uVar14;
  int value;
  TString builtInString;
  TSourceLoc loc_1;
  uint local_8c;
  HlslParseContext *local_88;
  TSourceLoc *local_80;
  uint local_74;
  TString local_70;
  TSourceLoc local_48;
  undefined4 extraout_var_18;
  
  if ((attributes->
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl._M_node._M_size != 0) {
    uVar14 = CONCAT71(in_register_00000081,allowEntry) & 0xffffffff;
    local_88 = this;
    local_80 = loc;
    local_70._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    for (p_Var3 = (attributes->
                  super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ).
                  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        (_List_node_header *)p_Var3 !=
        &(attributes->
         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>).
         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
         ._M_impl._M_node; p_Var3 = p_Var3->_M_next) {
      if (*(int *)&p_Var3[1]._M_next - 0x14U < 0x38) {
        this_00 = p_Var3 + 1;
        switch(*(int *)&p_Var3[1]._M_next) {
        case 0x14:
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,0);
          if (bVar7) {
            local_74 = (uint)uVar14;
            uVar5 = (undefined2)local_8c;
            iVar8 = (*type->_vptr_TType[10])(type);
            *(undefined2 *)(CONCAT44(extraout_var,iVar8) + 0x20) = uVar5;
            uVar14 = (ulong)local_74;
            iVar8 = (*type->_vptr_TType[10])(type);
            puVar1 = (ulong *)(CONCAT44(extraout_var_00,iVar8) + 0x1c);
            *puVar1 = *puVar1 & 0xffffffffffc07fff;
          }
          else {
            (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_88,local_80,"needs a literal integer","binding","");
          }
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,1);
          uVar6 = local_8c;
          if (bVar7) {
            iVar8 = (*type->_vptr_TType[10])(type);
            lVar9 = CONCAT44(extraout_var_49,iVar8);
            uVar10 = *(ulong *)(lVar9 + 0x1c) & 0xffffffffffc07fff | (ulong)((uVar6 & 0x7f) << 0xf);
LAB_0040e6ef:
            *(ulong *)(lVar9 + 0x1c) = uVar10;
          }
          break;
        case 0x15:
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,0);
          if (bVar7) {
            (local_88->super_TParseContextBase).globalUniformBinding = local_8c;
          }
          else {
            (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_88,local_80,"needs a literal integer","global binding","");
          }
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,1);
          if (bVar7) {
            (local_88->super_TParseContextBase).globalUniformSet = local_8c;
          }
          break;
        case 0x16:
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,0);
          uVar6 = local_8c;
          if (bVar7) {
            iVar8 = (*type->_vptr_TType[10])(type);
            lVar9 = CONCAT44(extraout_var_18,iVar8);
            uVar10 = *(ulong *)(lVar9 + 0x1c) & 0xfffffffffffff000 | (ulong)(uVar6 & 0xfff);
            goto LAB_0040e6ef;
          }
          pp_Var13 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar12 = "needs a literal integer";
          pcVar11 = "location";
LAB_0040e778:
          (*pp_Var13[0x2d])(local_88,local_80,pcVar12,pcVar11,"");
          break;
        case 0x17:
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,0);
          if (!bVar7) {
            pp_Var13 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            ;
            pcVar12 = "needs a literal integer";
            pcVar11 = "input attachment";
            goto LAB_0040e778;
          }
          uVar4 = (undefined1)local_8c;
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_33,iVar8) + 0x28) = uVar4;
          break;
        case 0x18:
          bVar7 = TAttributeArgs::getString((TAttributeArgs *)this_00,&local_70,0,false);
          if ((bVar7) &&
             (iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(&local_70,"PointSize"), iVar8 == 0)) {
            iVar8 = (*type->_vptr_TType[10])(type);
            *(ulong *)(CONCAT44(extraout_var_35,iVar8) + 8) =
                 *(ulong *)(CONCAT44(extraout_var_35,iVar8) + 8) & 0xffffffffffff007f | 0xf80;
          }
          break;
        case 0x19:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_21,iVar8) + 0x2d) = 1;
          break;
        case 0x1a:
          iVar8 = (*type->_vptr_TType[10])(type);
          if ((*(uint *)(CONCAT44(extraout_var_25,iVar8) + 8) & 0x7f) != 2) {
            pp_Var13 = (local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            ;
            pcVar12 = "needs a const type";
            pcVar11 = "constant_id";
            goto LAB_0040e778;
          }
          bVar7 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&local_8c,0);
          if (bVar7) {
            local_48.name = (TString *)0x0;
            local_48.string = 0;
            local_48.line = 0;
            local_48.column = 0;
            iVar8 = (*type->_vptr_TType[10])(type);
            setSpecConstantId(local_88,&local_48,(TQualifier *)CONCAT44(extraout_var_26,iVar8),
                              local_8c);
          }
          break;
        default:
          goto switchD_0040e18d_caseD_1b;
        case 0x22:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_27,iVar8) + 0x2c) = 1;
          break;
        case 0x23:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_38,iVar8) + 0x2c) = 2;
          break;
        case 0x24:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_37,iVar8) + 0x2c) = 3;
          break;
        case 0x25:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_11,iVar8) + 0x2c) = 4;
          break;
        case 0x26:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_22,iVar8) + 0x2c) = 5;
          break;
        case 0x27:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_16,iVar8) + 0x2c) = 7;
          break;
        case 0x28:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_08,iVar8) + 0x2c) = 8;
          break;
        case 0x29:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_29,iVar8) + 0x2c) = 9;
          break;
        case 0x2a:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_30,iVar8) + 0x2c) = 10;
          break;
        case 0x2b:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_41,iVar8) + 0x2c) = 0xb;
          break;
        case 0x2c:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_39,iVar8) + 0x2c) = 0xc;
          break;
        case 0x2d:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_06,iVar8) + 0x2c) = 0xd;
          break;
        case 0x2e:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_17,iVar8) + 0x2c) = 0xe;
          break;
        case 0x2f:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_43,iVar8) + 0x2c) = 0xf;
          break;
        case 0x30:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_07,iVar8) + 0x2c) = 0x10;
          break;
        case 0x31:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_15,iVar8) + 0x2c) = 0x11;
          break;
        case 0x32:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_10,iVar8) + 0x2c) = 0x12;
          break;
        case 0x33:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_23,iVar8) + 0x2c) = 0x13;
          break;
        case 0x34:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_09,iVar8) + 0x2c) = 0x14;
          break;
        case 0x35:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_45,iVar8) + 0x2c) = 0x15;
          break;
        case 0x36:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_44,iVar8) + 0x2c) = 0x17;
          break;
        case 0x37:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_13,iVar8) + 0x2c) = 0x18;
          break;
        case 0x38:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_19,iVar8) + 0x2c) = 0x19;
          break;
        case 0x39:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_32,iVar8) + 0x2c) = 0x1a;
          break;
        case 0x3a:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_20,iVar8) + 0x2c) = 0x1c;
          break;
        case 0x3b:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_47,iVar8) + 0x2c) = 0x1d;
          break;
        case 0x3c:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_12,iVar8) + 0x2c) = 0x1e;
          break;
        case 0x3d:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_40,iVar8) + 0x2c) = 0x1f;
          break;
        case 0x3e:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_46,iVar8) + 0x2c) = 0x20;
          break;
        case 0x3f:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_04,iVar8) + 0x2c) = 0x23;
          break;
        case 0x40:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_36,iVar8) + 0x2c) = 0x24;
          break;
        case 0x41:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_03,iVar8) + 0x2c) = 0x25;
          break;
        case 0x42:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_02,iVar8) + 0x2c) = 0x26;
          break;
        case 0x43:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_14,iVar8) + 0x2c) = 0x2a;
          break;
        case 0x44:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_24,iVar8) + 0x2c) = 0x28;
          break;
        case 0x45:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_42,iVar8) + 0x2c) = 0x29;
          break;
        case 0x46:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_01,iVar8) + 0x2c) = 0x2b;
          break;
        case 0x47:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_05,iVar8) + 0x2c) = 0x2c;
          break;
        case 0x48:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_28,iVar8) + 0x2c) = 0x2d;
          break;
        case 0x49:
          iVar8 = (*type->_vptr_TType[10])(type);
          *(undefined1 *)(CONCAT44(extraout_var_34,iVar8) + 0x2c) = 0;
          break;
        case 0x4a:
          iVar8 = (*type->_vptr_TType[10])(type);
          pbVar2 = (byte *)(CONCAT44(extraout_var_48,iVar8) + 0xd);
          *pbVar2 = *pbVar2 | 0x80;
          break;
        case 0x4b:
          iVar8 = (*type->_vptr_TType[10])(type);
          pbVar2 = (byte *)(CONCAT44(extraout_var_31,iVar8) + 0xe);
          *pbVar2 = *pbVar2 | 1;
        }
      }
      else {
switchD_0040e18d_caseD_1b:
        if ((char)uVar14 == '\0') {
          (*(local_88->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (local_88,local_80,"attribute does not apply to a type","","");
        }
      }
    }
  }
  return;
}

Assistant:

void HlslParseContext::transferTypeAttributes(const TSourceLoc& loc, const TAttributes& attributes, TType& type,
    bool allowEntry)
{
    if (attributes.size() == 0)
        return;

    int value;
    TString builtInString;
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatLocation:
            // location
            if (it->getInt(value))
                type.getQualifier().layoutLocation = value;
            else
                error(loc, "needs a literal integer", "location", "");
            break;
        case EatBinding:
            // binding
            if (it->getInt(value)) {
                type.getQualifier().layoutBinding = value;
                type.getQualifier().layoutSet = 0;
            } else
                error(loc, "needs a literal integer", "binding", "");
            // set
            if (it->getInt(value, 1))
                type.getQualifier().layoutSet = value;
            break;
        case EatGlobalBinding:
            // global cbuffer binding
            if (it->getInt(value))
                globalUniformBinding = value;
            else
                error(loc, "needs a literal integer", "global binding", "");
            // global cbuffer set
            if (it->getInt(value, 1))
                globalUniformSet = value;
            break;
        case EatInputAttachment:
            // input attachment
            if (it->getInt(value))
                type.getQualifier().layoutAttachment = value;
            else
                error(loc, "needs a literal integer", "input attachment", "");
            break;
        case EatBuiltIn:
            // PointSize built-in
            if (it->getString(builtInString, 0, false)) {
                if (builtInString == "PointSize")
                    type.getQualifier().builtIn = EbvPointSize;
            }
            break;
        case EatPushConstant:
            // push_constant
            type.getQualifier().layoutPushConstant = true;
            break;
        case EatConstantId:
            // specialization constant
            if (type.getQualifier().storage != EvqConst) {
                error(loc, "needs a const type", "constant_id", "");
                break;
            }
            if (it->getInt(value)) {
                TSourceLoc loc;
                loc.init();
                setSpecConstantId(loc, type.getQualifier(), value);
            }
            break;

        // image formats
        case EatFormatRgba32f:      type.getQualifier().layoutFormat = ElfRgba32f;      break;
        case EatFormatRgba16f:      type.getQualifier().layoutFormat = ElfRgba16f;      break;
        case EatFormatR32f:         type.getQualifier().layoutFormat = ElfR32f;         break;
        case EatFormatRgba8:        type.getQualifier().layoutFormat = ElfRgba8;        break;
        case EatFormatRgba8Snorm:   type.getQualifier().layoutFormat = ElfRgba8Snorm;   break;
        case EatFormatRg32f:        type.getQualifier().layoutFormat = ElfRg32f;        break;
        case EatFormatRg16f:        type.getQualifier().layoutFormat = ElfRg16f;        break;
        case EatFormatR11fG11fB10f: type.getQualifier().layoutFormat = ElfR11fG11fB10f; break;
        case EatFormatR16f:         type.getQualifier().layoutFormat = ElfR16f;         break;
        case EatFormatRgba16:       type.getQualifier().layoutFormat = ElfRgba16;       break;
        case EatFormatRgb10A2:      type.getQualifier().layoutFormat = ElfRgb10A2;      break;
        case EatFormatRg16:         type.getQualifier().layoutFormat = ElfRg16;         break;
        case EatFormatRg8:          type.getQualifier().layoutFormat = ElfRg8;          break;
        case EatFormatR16:          type.getQualifier().layoutFormat = ElfR16;          break;
        case EatFormatR8:           type.getQualifier().layoutFormat = ElfR8;           break;
        case EatFormatRgba16Snorm:  type.getQualifier().layoutFormat = ElfRgba16Snorm;  break;
        case EatFormatRg16Snorm:    type.getQualifier().layoutFormat = ElfRg16Snorm;    break;
        case EatFormatRg8Snorm:     type.getQualifier().layoutFormat = ElfRg8Snorm;     break;
        case EatFormatR16Snorm:     type.getQualifier().layoutFormat = ElfR16Snorm;     break;
        case EatFormatR8Snorm:      type.getQualifier().layoutFormat = ElfR8Snorm;      break;
        case EatFormatRgba32i:      type.getQualifier().layoutFormat = ElfRgba32i;      break;
        case EatFormatRgba16i:      type.getQualifier().layoutFormat = ElfRgba16i;      break;
        case EatFormatRgba8i:       type.getQualifier().layoutFormat = ElfRgba8i;       break;
        case EatFormatR32i:         type.getQualifier().layoutFormat = ElfR32i;         break;
        case EatFormatRg32i:        type.getQualifier().layoutFormat = ElfRg32i;        break;
        case EatFormatRg16i:        type.getQualifier().layoutFormat = ElfRg16i;        break;
        case EatFormatRg8i:         type.getQualifier().layoutFormat = ElfRg8i;         break;
        case EatFormatR16i:         type.getQualifier().layoutFormat = ElfR16i;         break;
        case EatFormatR8i:          type.getQualifier().layoutFormat = ElfR8i;          break;
        case EatFormatRgba32ui:     type.getQualifier().layoutFormat = ElfRgba32ui;     break;
        case EatFormatRgba16ui:     type.getQualifier().layoutFormat = ElfRgba16ui;     break;
        case EatFormatRgba8ui:      type.getQualifier().layoutFormat = ElfRgba8ui;      break;
        case EatFormatR32ui:        type.getQualifier().layoutFormat = ElfR32ui;        break;
        case EatFormatRgb10a2ui:    type.getQualifier().layoutFormat = ElfRgb10a2ui;    break;
        case EatFormatRg32ui:       type.getQualifier().layoutFormat = ElfRg32ui;       break;
        case EatFormatRg16ui:       type.getQualifier().layoutFormat = ElfRg16ui;       break;
        case EatFormatRg8ui:        type.getQualifier().layoutFormat = ElfRg8ui;        break;
        case EatFormatR16ui:        type.getQualifier().layoutFormat = ElfR16ui;        break;
        case EatFormatR8ui:         type.getQualifier().layoutFormat = ElfR8ui;         break;
        case EatFormatUnknown:      type.getQualifier().layoutFormat = ElfNone;         break;

        case EatNonWritable:  type.getQualifier().readonly = true;   break;
        case EatNonReadable:  type.getQualifier().writeonly = true;  break;

        default:
            if (! allowEntry)
                warn(loc, "attribute does not apply to a type", "", "");
            break;
        }
    }
}